

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

string * __thiscall
phosg::freadx_abi_cxx11_(string *__return_storage_ptr__,phosg *this,FILE *f,size_t size)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(size_type)f,'\0');
  freadx((FILE *)this,(__return_storage_ptr__->_M_dataplus)._M_p,(size_t)f);
  return __return_storage_ptr__;
}

Assistant:

string freadx(FILE* f, size_t size) {
  string ret(size, 0);
  freadx(f, ret.data(), size);
  return ret;
}